

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFastFieldEntries
          (ParseFunctionGenerator *this,Formatter *format,string *fallback)

{
  bool bVar1;
  pointer this_00;
  ulong uVar2;
  LogMessage *other;
  FieldDescriptor *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  string local_b8;
  uint8_t local_91;
  unsigned_short local_90;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  reference local_40;
  FieldInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>
  *__range3;
  string *fallback_local;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  this_00 = std::
            unique_ptr<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
            ::operator->(&this->tc_table_info_);
  __end3 = std::
           vector<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>
           ::begin(&this_00->fast_path_fields);
  info = (FieldInfo *)
         std::
         vector<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>
         ::end(&this_00->fast_path_fields);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo_*,_std::vector<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>_>
                                     *)&info), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo_*,_std::vector<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>_>
               ::operator*(&__end3);
    if (local_40->field != (FieldDescriptor *)0x0) {
      PrintFieldComment<google::protobuf::FieldDescriptor>(format,local_40->field);
    }
    uVar2 = std::__cxx11::string::empty();
    local_c8 = fallback;
    if ((uVar2 & 1) == 0) {
      local_c8 = &local_40->func_name;
    }
    Formatter::operator()(format,"{$1$, ",local_c8);
    if ((local_40->bits).data == 0) {
      Formatter::operator()<>(format,"{}");
    }
    else {
      local_79 = 0;
      if (local_40->field == (FieldDescriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                   ,0x262);
        local_79 = 1;
        other = internal::LogMessage::operator<<
                          (&local_78,"CHECK failed: (nullptr) != (info.field): ");
        internal::LogFinisher::operator=(local_8d,other);
      }
      if ((local_79 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_78);
      }
      local_90 = internal::TcFieldData::coded_tag<unsigned_short>(&local_40->bits);
      local_91 = internal::TcFieldData::hasbit_idx(&local_40->bits);
      FieldName_abi_cxx11_(&local_b8,(cpp *)local_40->field,field);
      Formatter::operator()
                (format,
                 "{$1$, $2$, static_cast<uint16_t>(PROTOBUF_FIELD_OFFSET($classname$, $3$_))}",
                 &local_90,&local_91,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    Formatter::operator()<>(format,"},\n");
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo_*,_std::vector<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFastFieldEntries(
    Formatter& format, const std::string& fallback) {
  for (const auto& info : tc_table_info_->fast_path_fields) {
    if (info.field != nullptr) {
      PrintFieldComment(format, info.field);
    }
    format("{$1$, ", info.func_name.empty() ? fallback : info.func_name);
    if (info.bits.data) {
      GOOGLE_DCHECK_NE(nullptr, info.field);
      format(
          "{$1$, $2$, "
          "static_cast<uint16_t>(PROTOBUF_FIELD_OFFSET($classname$, $3$_))}",
          info.bits.coded_tag(), info.bits.hasbit_idx(), FieldName(info.field));
    } else {
      format("{}");
    }
    format("},\n");
  }
}